

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

void relive::LogManager::registerIsActive
               (string *className,int level,atomic<bool> *isInit,bool *isActive)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar5;
  string name;
  _Alloc_node __an;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_relive::LogManager::LogPoint>
  local_80;
  string local_50;
  _Alloc_node local_30;
  
  paVar1 = &local_80.first.field_2;
  local_80.first._M_string_length = 0;
  local_80.first.field_2._M_local_buf[0] = '\0';
  local_80.first._M_dataplus._M_p = (pointer)paVar1;
  instance(&local_80.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.first._M_dataplus._M_p,
                    CONCAT71(local_80.first.field_2._M_allocated_capacity._1_7_,
                             local_80.first.field_2._M_local_buf[0]) + 1);
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&instance::logManager);
  if (iVar2 == 0) {
    if (((isInit->_M_base)._M_i & 1U) == 0) {
      detemplatedClassName(&local_50,className);
      (isInit->_M_base)._M_i = true;
      local_80.first._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_50._M_dataplus._M_p,
                 local_50._M_dataplus._M_p + local_50._M_string_length);
      local_80.second._level = level;
      local_80.second._isActive = isActive;
      pVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_relive::LogManager::LogPoint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_relive::LogManager::LogPoint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_relive::LogManager::LogPoint>_>_>
              ::_M_get_insert_equal_pos(&instance::logManager._logPoints._M_t,&local_80.first);
      local_30._M_t = &instance::logManager._logPoints._M_t;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,relive::LogManager::LogPoint>,std::_Select1st<std::pair<std::__cxx11::string_const,relive::LogManager::LogPoint>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,relive::LogManager::LogPoint>>>
      ::
      _M_insert_<std::pair<std::__cxx11::string_const,relive::LogManager::LogPoint>,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,relive::LogManager::LogPoint>,std::_Select1st<std::pair<std::__cxx11::string_const,relive::LogManager::LogPoint>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,relive::LogManager::LogPoint>>>::_Alloc_node>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,relive::LogManager::LogPoint>,std::_Select1st<std::pair<std::__cxx11::string_const,relive::LogManager::LogPoint>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,relive::LogManager::LogPoint>>>
                  *)&instance::logManager._logPoints,pVar5.first,pVar5.second,&local_80,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_80.first._M_dataplus._M_p,
                        CONCAT71(local_80.first.field_2._M_allocated_capacity._1_7_,
                                 local_80.first.field_2._M_local_buf[0]) + 1);
      }
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&instance::logManager._logLevels._M_t,&local_50);
      p_Var4 = (_Base_ptr)&instance::logManager._defaultLevel;
      if ((_Rb_tree_header *)iVar3._M_node !=
          &instance::logManager._logLevels._M_t._M_impl.super__Rb_tree_header) {
        p_Var4 = iVar3._M_node + 2;
      }
      *isActive = level <= (int)p_Var4->_M_color;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&instance::logManager);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void LogManager::registerIsActive(const std::string& className, int level, std::atomic<bool>& isInit, volatile bool& isActive)
{
    LogManager* logManager = instance();
    std::lock_guard<std::mutex> lock(logManager->_mutex);
    if (!isInit.load(std::memory_order_relaxed)) {
        std::string name = detemplatedClassName(className);
        isInit.store(true, std::memory_order_release);
        LogPoint point;
        point._level = level;
        point._isActive = &isActive;
        logManager->_logPoints.insert(LogPoints::value_type(name, point));
        LogLevels::const_iterator i = logManager->_logLevels.find(name);
        if(i != logManager->_logLevels.end())
        {
            isActive = i->second >= level;
        }
        else
        {
            isActive = logManager->_defaultLevel >= level;
        }
    }
}